

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_custom_request
              (LIBSSH2_CHANNEL *channel,int want_reply,char *request_type,uint request_type_len,
              char *data,uint data_len)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  uint data_len_local;
  char *data_local;
  uint request_type_len_local;
  char *request_type_local;
  int want_reply_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._0_4_ =
           channel_custom_request(channel,want_reply,request_type,request_type_len,data,data_len);
      if (((int)entry_time != -0x25) || (channel->session->api_block_mode == 0)) break;
      entry_time._0_4_ = _libssh2_wait_socket(channel->session,start_time);
    } while ((int)entry_time == 0);
    channel_local._4_4_ = (int)entry_time;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_custom_request(LIBSSH2_CHANNEL *channel, int want_reply,
                               const char *request_type, unsigned int request_type_len,
                               const char *data, unsigned int data_len) {
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_custom_request(channel, want_reply, request_type,
                                        request_type_len, data, data_len));
    return rc;
}